

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableRef::Deserialize(TableRef *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  TableReferenceType TVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer pTVar5;
  SerializationException *this_00;
  _func_int **pp_Var6;
  string str;
  undefined1 local_70 [40];
  string local_48 [8];
  tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_> local_40;
  char local_38 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    TVar2 = EnumUtil::FromString<duckdb::TableReferenceType>((char *)local_48);
    uVar3 = (uint)TVar2;
    if (local_48 != (string  [8])local_38) {
      operator_delete((void *)local_48);
    }
  }
  else {
    uVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"alias");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_48 = (string  [8])local_38;
    local_38[0] = '\0';
    local_40.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)
         (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            ((Deserializer *)(local_70 + 0x20),(field_id_t)deserializer,(char *)0x66);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"query_location");
  if ((char)iVar4 == '\0') {
    pp_Var6 = (_func_int **)0xffffffffffffffff;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    if (CONCAT44(extraout_var,iVar4) == 0xffffffffffffffff) {
      pp_Var6 = (_func_int **)0xffffffffffffffff;
    }
    else {
      optional_idx::optional_idx((optional_idx *)local_70,CONCAT44(extraout_var,iVar4));
      pp_Var6 = (_func_int **)local_70._0_8_;
    }
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  switch(uVar3 & 0xff) {
  case 1:
    BaseTableRef::Deserialize((BaseTableRef *)local_70,deserializer);
    break;
  case 2:
    SubqueryRef::Deserialize((SubqueryRef *)local_70,deserializer);
    break;
  case 3:
    JoinRef::Deserialize((JoinRef *)local_70,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Unsupported type for deserialization of TableRef!","");
    SerializationException::SerializationException(this_00,(string *)local_70);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 5:
    TableFunctionRef::Deserialize((TableFunctionRef *)local_70,deserializer);
    break;
  case 6:
    ExpressionListRef::Deserialize((ExpressionListRef *)local_70,deserializer);
    break;
  case 8:
    local_70._0_8_ = operator_new(0x68);
    *(undefined1 *)(local_70._0_8_ + 8) = 8;
    *(_func_int ***)(local_70._0_8_ + 0x10) = (_func_int **)(local_70._0_8_ + 0x20);
    *(_func_int **)(local_70._0_8_ + 0x18) = (_func_int *)0x0;
    *(undefined1 *)(local_70._0_8_ + 0x20) = 0;
    *(_func_int **)(local_70._0_8_ + 0x30) = (_func_int *)0x0;
    *(_func_int **)(local_70._0_8_ + 0x38) = (_func_int *)0xffffffffffffffff;
    *(_func_int **)(local_70._0_8_ + 0x40) = (_func_int *)0x0;
    *(_func_int **)(local_70._0_8_ + 0x48) = (_func_int *)0x0;
    *(_func_int **)(local_70._0_8_ + 0x50) = (_func_int *)0x0;
    *(_func_int **)(local_70._0_8_ + 0x58) = (_func_int *)0x0;
    *(_func_int **)(local_70._0_8_ + 0x60) = (_func_int *)0x0;
    *(undefined ***)local_70._0_8_ = &PTR__TableRef_02443048;
    break;
  case 9:
    PivotRef::Deserialize((PivotRef *)local_70,deserializer);
    break;
  case 10:
    ShowRef::Deserialize((ShowRef *)local_70,deserializer);
    break;
  case 0xb:
    ColumnDataRef::Deserialize((ColumnDataRef *)local_70,deserializer);
  }
  this->_vptr_TableRef = (_func_int **)local_70._0_8_;
  pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  ::std::__cxx11::string::operator=((string *)&pTVar5->alias,local_48);
  pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  uVar1 = local_70._32_8_;
  local_70._32_8_ = (Value *)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pTVar5->sample,(pointer)uVar1);
  pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  uVar1 = local_70._32_8_;
  (pTVar5->query_location).index = (idx_t)pp_Var6;
  if ((Value *)local_70._32_8_ != (Value *)0x0) {
    Value::~Value((Value *)local_70._32_8_);
    operator_delete((void *)uVar1);
  }
  if (local_48 != (string  [8])local_38) {
    operator_delete((void *)local_48);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> TableRef::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<TableReferenceType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	auto sample = deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(102, "sample");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	unique_ptr<TableRef> result;
	switch (type) {
	case TableReferenceType::BASE_TABLE:
		result = BaseTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::COLUMN_DATA:
		result = ColumnDataRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EMPTY_FROM:
		result = EmptyTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EXPRESSION_LIST:
		result = ExpressionListRef::Deserialize(deserializer);
		break;
	case TableReferenceType::JOIN:
		result = JoinRef::Deserialize(deserializer);
		break;
	case TableReferenceType::PIVOT:
		result = PivotRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SHOW_REF:
		result = ShowRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SUBQUERY:
		result = SubqueryRef::Deserialize(deserializer);
		break;
	case TableReferenceType::TABLE_FUNCTION:
		result = TableFunctionRef::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableRef!");
	}
	result->alias = std::move(alias);
	result->sample = std::move(sample);
	result->query_location = query_location;
	return result;
}